

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O1

void Emb_ManDerivePlacement(Emb_Man_t *p,int nSols)

{
  float *pArray;
  int iVar1;
  float *pArray_00;
  int iVar2;
  long lVar3;
  int *__ptr;
  int *__ptr_00;
  unsigned_short *puVar4;
  unsigned_short uVar5;
  long lVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  
  if (nSols == 2) {
    pArray_00 = p->pSols;
    iVar1 = p->nObjs;
    lVar6 = (long)iVar1;
    if (lVar6 < 1) {
      fVar9 = -1e+09;
      fVar8 = 1e+09;
    }
    else {
      fVar8 = 1e+09;
      fVar9 = -1e+09;
      lVar3 = 0;
      do {
        iVar7 = (int)pArray_00[lVar3];
        iVar2 = (int)fVar8;
        if (iVar7 <= (int)fVar8) {
          iVar2 = iVar7;
        }
        fVar8 = (float)iVar2;
        if (iVar7 < (int)fVar9) {
          iVar7 = (int)fVar9;
        }
        fVar9 = (float)iVar7;
        lVar3 = lVar3 + 1;
      } while (lVar6 != lVar3);
    }
    if (0 < iVar1) {
      lVar3 = 0;
      do {
        pArray_00[lVar3] =
             (float)(-(uint)(pArray_00[lVar3] != 0.0) &
                    (uint)((pArray_00[lVar3] - fVar8) * (32767.0 / (fVar9 - fVar8))));
        lVar3 = lVar3 + 1;
      } while (lVar6 != lVar3);
    }
    pArray = pArray_00 + lVar6;
    if (iVar1 < 1) {
      fVar9 = -1e+09;
      fVar8 = 1e+09;
    }
    else {
      fVar8 = 1e+09;
      fVar9 = -1e+09;
      lVar3 = 0;
      do {
        iVar7 = (int)pArray[lVar3];
        iVar2 = (int)fVar8;
        if (iVar7 <= (int)fVar8) {
          iVar2 = iVar7;
        }
        fVar8 = (float)iVar2;
        if (iVar7 < (int)fVar9) {
          iVar7 = (int)fVar9;
        }
        fVar9 = (float)iVar7;
        lVar3 = lVar3 + 1;
      } while (lVar6 != lVar3);
    }
    if (0 < iVar1) {
      lVar3 = 0;
      do {
        pArray[lVar3] =
             (float)(-(uint)(pArray[lVar3] != 0.0) &
                    (uint)((pArray[lVar3] - fVar8) * (32767.0 / (fVar9 - fVar8))));
        lVar3 = lVar3 + 1;
      } while (lVar6 != lVar3);
    }
    __ptr = Gia_SortFloats(pArray_00,(int *)0x0,iVar1);
    __ptr_00 = Gia_SortFloats(pArray,(int *)0x0,p->nObjs);
    iVar1 = p->nObjs;
    lVar6 = (long)iVar1;
    puVar4 = (unsigned_short *)malloc(lVar6 * 4);
    p->pPlacement = puVar4;
    if (0 < lVar6) {
      lVar3 = 0;
      do {
        uVar5 = (unsigned_short)(int)(((double)(int)lVar3 * 32767.0) / (double)iVar1);
        puVar4[(long)__ptr[lVar3] * 2] = uVar5;
        puVar4[(long)__ptr_00[lVar3] * 2 + 1] = uVar5;
        lVar3 = lVar3 + 1;
      } while (lVar6 != lVar3);
    }
    if (__ptr != (int *)0x0) {
      free(__ptr);
    }
    if (__ptr_00 != (int *)0x0) {
      free(__ptr_00);
      return;
    }
  }
  return;
}

Assistant:

void Emb_ManDerivePlacement( Emb_Man_t * p, int nSols )
{
    float * pY0, * pY1, Max0, Max1, Min0, Min1, Str0, Str1;
    int * pPerm0, * pPerm1;
    int k;
    if ( nSols != 2 )
        return;
    // compute intervals
    Min0 =  ABC_INFINITY;
    Max0 = -ABC_INFINITY;
    pY0 = Emb_ManSol( p, 0 );
    for ( k = 0; k < p->nObjs; k++ )
    {
        Min0 = Abc_MinInt( Min0, pY0[k] );
        Max0 = Abc_MaxInt( Max0, pY0[k] );
    }
    Str0 = 1.0*GIA_PLACE_SIZE/(Max0 - Min0);
    // update the coordinates
    for ( k = 0; k < p->nObjs; k++ )
        pY0[k] = (pY0[k] != 0.0) ? ((pY0[k] - Min0) * Str0) : 0.0;

    // compute intervals
    Min1 =  ABC_INFINITY;
    Max1 = -ABC_INFINITY;
    pY1 = Emb_ManSol( p, 1 );
    for ( k = 0; k < p->nObjs; k++ )
    {
        Min1 = Abc_MinInt( Min1, pY1[k] );
        Max1 = Abc_MaxInt( Max1, pY1[k] );
    }
    Str1 = 1.0*GIA_PLACE_SIZE/(Max1 - Min1);
    // update the coordinates
    for ( k = 0; k < p->nObjs; k++ )
        pY1[k] = (pY1[k] != 0.0) ? ((pY1[k] - Min1) * Str1) : 0.0;

    // derive the order of these numbers
    pPerm0 = Gia_SortFloats( pY0, NULL, p->nObjs );
    pPerm1 = Gia_SortFloats( pY1, NULL, p->nObjs );

    // average solutions and project them into square [0;GIA_PLACE_SIZE] x [0;GIA_PLACE_SIZE]
    p->pPlacement = ABC_ALLOC( unsigned short, 2 * p->nObjs );
    for ( k = 0; k < p->nObjs; k++ )
    {
        p->pPlacement[2*pPerm0[k]+0] = (unsigned short)(int)(1.0 * k * GIA_PLACE_SIZE / p->nObjs);
        p->pPlacement[2*pPerm1[k]+1] = (unsigned short)(int)(1.0 * k * GIA_PLACE_SIZE / p->nObjs);
    }
    ABC_FREE( pPerm0 );
    ABC_FREE( pPerm1 );
}